

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O3

void __thiscall
FormatterTest_WideFormatString_Test::TestBody(FormatterTest_WideFormatString_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  bool bVar2;
  char *pcVar3;
  basic_string_view<wchar_t> format_str;
  basic_string_view<wchar_t> format_str_00;
  basic_string_view<wchar_t> format_str_01;
  basic_string_view<wchar_t> format_str_02;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  args_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  args_01;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  args_02;
  AssertionResult gtest_ar;
  internal local_858 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_850;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_848;
  wchar_t *local_828 [3];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_810;
  undefined1 *local_808;
  long local_800;
  undefined8 local_7f8;
  undefined1 local_7f0 [2000];
  
  local_828[0] = (wchar_t *)0x2a;
  local_800 = 0;
  local_810.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3d40
  ;
  local_7f8 = 500;
  format_str.size_ = 2;
  format_str.data_ = L"{}";
  args.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
        *)local_828;
  args.types_ = fmt::v5::
                format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>,int>
                ::TYPES;
  local_808 = local_7f0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>,wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            ((range)&local_810,format_str,args,(locale_ref)0x0);
  paVar1 = &local_848.field_2;
  local_848._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_848,local_808,local_808 + local_800 * 4);
  local_810.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3d40
  ;
  if (local_808 != local_7f0) {
    operator_delete(local_808);
  }
  testing::internal::CmpHelperEQ<wchar_t[3],std::__cxx11::wstring>
            (local_858,"L\"42\"","format(L\"{}\", 42)",(wchar_t (*) [3])L"42",&local_848);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_848._M_dataplus._M_p != paVar1) {
    operator_delete(local_848._M_dataplus._M_p);
  }
  if (local_858[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_810);
    if (local_850.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_850.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_848,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x66f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_848,(Message *)&local_810);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_848);
    if (local_810.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_810.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_810.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_850,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_828[0] = (wchar_t *)&DAT_4010cccccccccccd;
  local_800 = 0;
  local_810.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3d40
  ;
  local_7f8 = 500;
  format_str_00.size_ = 2;
  format_str_00.data_ = L"{}";
  args_00.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
        *)local_828;
  args_00.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>,double>
       ::TYPES;
  local_808 = local_7f0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>,wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            ((range)&local_810,format_str_00,args_00,(locale_ref)0x0);
  local_848._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_848,local_808,local_808 + local_800 * 4);
  local_810.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3d40
  ;
  if (local_808 != local_7f0) {
    operator_delete(local_808);
  }
  testing::internal::CmpHelperEQ<wchar_t[4],std::__cxx11::wstring>
            (local_858,"L\"4.2\"","format(L\"{}\", 4.2)",(wchar_t (*) [4])L"4.2",&local_848);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_848._M_dataplus._M_p != paVar1) {
    operator_delete(local_848._M_dataplus._M_p);
  }
  if (local_858[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_810);
    if (local_850.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_850.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_848,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x670,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_848,(Message *)&local_810);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_848);
    if (local_810.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_810.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_810.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_850,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_828[0] = L"abc";
  local_800 = 0;
  local_810.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3d40
  ;
  local_7f8 = 500;
  format_str_01.size_ = 2;
  format_str_01.data_ = L"{}";
  args_01.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
        *)local_828;
  args_01.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>,wchar_t[4]>
       ::TYPES;
  local_808 = local_7f0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>,wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            ((range)&local_810,format_str_01,args_01,(locale_ref)0x0);
  local_848._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_848,local_808,local_808 + local_800 * 4);
  local_810.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3d40
  ;
  if (local_808 != local_7f0) {
    operator_delete(local_808);
  }
  testing::internal::CmpHelperEQ<wchar_t[4],std::__cxx11::wstring>
            (local_858,"L\"abc\"","format(L\"{}\", L\"abc\")",(wchar_t (*) [4])L"abc",&local_848);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_848._M_dataplus._M_p != paVar1) {
    operator_delete(local_848._M_dataplus._M_p);
  }
  if (local_858[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_810);
    if (local_850.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_850.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_848,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x671,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_848,(Message *)&local_810);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_848);
    if (local_810.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_810.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_810.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_850,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_828[0] = (wchar_t *)0x7a;
  local_800 = 0;
  local_810.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3d40
  ;
  local_7f8 = 500;
  format_str_02.size_ = 2;
  format_str_02.data_ = L"{}";
  args_02.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
        *)local_828;
  args_02.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>,wchar_t>
       ::TYPES;
  local_808 = local_7f0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>,wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            ((range)&local_810,format_str_02,args_02,(locale_ref)0x0);
  local_848._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_848,local_808,local_808 + local_800 * 4);
  local_810.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3d40
  ;
  if (local_808 != local_7f0) {
    operator_delete(local_808);
  }
  testing::internal::CmpHelperEQ<wchar_t[2],std::__cxx11::wstring>
            (local_858,"L\"z\"","format(L\"{}\", L\'z\')",(wchar_t (*) [2])L"z",&local_848);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_848._M_dataplus._M_p != paVar1) {
    operator_delete(local_848._M_dataplus._M_p);
  }
  if (local_858[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_810);
    if (local_850.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_850.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_848,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x672,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_848,(Message *)&local_810);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_848);
    if (local_810.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_810.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_810.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_850,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(FormatterTest, WideFormatString) {
  EXPECT_EQ(L"42", format(L"{}", 42));
  EXPECT_EQ(L"4.2", format(L"{}", 4.2));
  EXPECT_EQ(L"abc", format(L"{}", L"abc"));
  EXPECT_EQ(L"z", format(L"{}", L'z'));
}